

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O2

wchar_t sftp_cmd_cd(sftp_command *cmd)

{
  char *pcVar1;
  sftp_request *psVar2;
  sftp_packet *psVar3;
  fxp_handle *handle;
  char *ptr;
  char *pcVar4;
  
  if (backend == (Backend *)0x0) {
    not_connected();
  }
  else {
    if (cmd->nwords < 2) {
      pcVar1 = dupstr(homedir);
    }
    else {
      pcVar1 = canonify(cmd->words[1]);
    }
    psVar2 = fxp_opendir_send(pcVar1);
    psVar3 = sftp_wait_for_reply(psVar2);
    handle = fxp_opendir_recv(psVar3,psVar2);
    if (handle != (fxp_handle *)0x0) {
      psVar2 = fxp_close_send(handle);
      psVar3 = sftp_wait_for_reply(psVar2);
      fxp_close_recv(psVar3,psVar2);
      safefree(pwd);
      pwd = pcVar1;
      pcVar1 = stripctrl_string(string_scc,pcVar1);
      while (pcVar1 != (char *)0x0) {
        printf("Remote directory is now %s\n",pcVar1);
        safefree(pcVar1);
        pcVar1 = (char *)0x0;
      }
      return L'\x01';
    }
    ptr = stripctrl_string(string_scc,pcVar1);
    while (ptr != (char *)0x0) {
      pcVar4 = fxp_error();
      printf("Directory %s: %s\n",ptr,pcVar4);
      safefree(ptr);
      ptr = (char *)0x0;
    }
    safefree(pcVar1);
  }
  return L'\0';
}

Assistant:

int sftp_cmd_cd(struct sftp_command *cmd)
{
    struct fxp_handle *dirh;
    struct sftp_packet *pktin;
    struct sftp_request *req;
    char *dir;

    if (!backend) {
        not_connected();
        return 0;
    }

    if (cmd->nwords < 2)
        dir = dupstr(homedir);
    else {
        dir = canonify(cmd->words[1]);
    }

    req = fxp_opendir_send(dir);
    pktin = sftp_wait_for_reply(req);
    dirh = fxp_opendir_recv(pktin, req);

    if (!dirh) {
        with_stripctrl(san, dir)
            printf("Directory %s: %s\n", san, fxp_error());
        sfree(dir);
        return 0;
    }

    req = fxp_close_send(dirh);
    pktin = sftp_wait_for_reply(req);
    fxp_close_recv(pktin, req);

    sfree(pwd);
    pwd = dir;
    with_stripctrl(san, pwd)
        printf("Remote directory is now %s\n", san);

    return 1;
}